

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_objectmodel.cpp
# Opt level: O3

void __thiscall VCLinkerTool::VCLinkerTool(VCLinkerTool *this)

{
  (this->super_VCToolBase)._vptr_VCToolBase = (_func_int **)&PTR__VCLinkerTool_002e2cf0;
  (this->AdditionalDependencies).d.d = (Data *)0x0;
  (this->AdditionalDependencies).d.ptr = (QString *)0x0;
  *(undefined1 (*) [16])&(this->AdditionalDependencies).d.size = (undefined1  [16])0x0;
  (this->AdditionalLibraryDirectories).d.ptr = (QString *)0x0;
  (this->AdditionalLibraryDirectories).d.size = 0;
  (this->AdditionalOptions).d.d = (Data *)0x0;
  (this->AdditionalOptions).d.ptr = (QString *)0x0;
  *(undefined1 (*) [16])&(this->AdditionalOptions).d.size = (undefined1  [16])0x0;
  (this->AddModuleNamesToAssembly).d.ptr = (QString *)0x0;
  (this->AddModuleNamesToAssembly).d.size = 0;
  (this->BaseAddress).d.d = (Data *)0x0;
  (this->BaseAddress).d.ptr = (char16_t *)0x0;
  (this->BaseAddress).d.size = 0;
  this->DataExecutionPrevention = unset;
  (this->DelayLoadDLLs).d.d = (Data *)0x0;
  (this->DelayLoadDLLs).d.ptr = (QString *)0x0;
  *(undefined1 (*) [16])((long)&(this->DelayLoadDLLs).d.ptr + 4) = (undefined1  [16])0x0;
  (this->EntryPointSymbol).d.d = (Data *)0x0;
  (this->EntryPointSymbol).d.ptr = (char16_t *)0x0;
  *(undefined1 (*) [16])&(this->EntryPointSymbol).d.size = (undefined1  [16])0x0;
  (this->ForceSymbolReferences).d.ptr = (QString *)0x0;
  (this->ForceSymbolReferences).d.size = 0;
  (this->FunctionOrder).d.d = (Data *)0x0;
  (this->FunctionOrder).d.ptr = (char16_t *)0x0;
  (this->FunctionOrder).d.size = 0;
  this->GenerateDebugInformation = unset;
  this->DebugInfoOption = linkerDebugOptionNone;
  this->GenerateMapFile = unset;
  this->IgnoreAllDefaultLibraries = unset;
  *(undefined4 *)&this->HeapCommitSize = 0xffffffff;
  *(undefined4 *)((long)&this->HeapCommitSize + 4) = 0xffffffff;
  *(undefined4 *)&this->HeapReserveSize = 0xffffffff;
  *(undefined4 *)((long)&this->HeapReserveSize + 4) = 0xffffffff;
  (this->IgnoreDefaultLibraryNames).d.size = 0;
  (this->IgnoreDefaultLibraryNames).d.d = (Data *)0x0;
  (this->IgnoreDefaultLibraryNames).d.ptr = (QString *)0x0;
  this->IgnoreEmbeddedIDL = unset;
  this->IgnoreImportLibrary = _True;
  this->ImageHasSafeExceptionHandlers = unset;
  *(undefined1 (*) [16])((long)&(this->ImportLibrary).d.ptr + 4) = (undefined1  [16])0x0;
  (this->ImportLibrary).d.d = (Data *)0x0;
  (this->ImportLibrary).d.ptr = (char16_t *)0x0;
  this->LinkDLL = unset;
  (this->LinkToManagedResourceFile).d.ptr = (char16_t *)0x0;
  (this->LinkToManagedResourceFile).d.size = 0;
  this->LinkIncremental = linkIncrementalDefault;
  this->LinkTimeCodeGeneration = optLTCGDefault;
  (this->LinkToManagedResourceFile).d.d = (Data *)0x0;
  this->MapExports = unset;
  (this->MapFileName).d.size = 0;
  (this->MapFileName).d.d = (Data *)0x0;
  (this->MapFileName).d.ptr = (char16_t *)0x0;
  this->MapLines = unset;
  memset(&this->MergedIDLBaseFileName,0,0x98);
  this->RandomizedBaseAddress = unset;
  this->RegisterOutput = unset;
  this->ResourceOnlyDLL = unset;
  this->SetChecksum = unset;
  this->ShowProgress = linkProgressNotSet;
  *(undefined4 *)&this->StackCommitSize = 0xffffffff;
  *(undefined4 *)((long)&this->StackCommitSize + 4) = 0xffffffff;
  *(undefined4 *)&this->StackReserveSize = 0xffffffff;
  *(undefined4 *)((long)&this->StackReserveSize + 4) = 0xffffffff;
  (this->StripPrivateSymbols).d.d = (Data *)0x0;
  (this->StripPrivateSymbols).d.ptr = (char16_t *)0x0;
  *(undefined1 (*) [16])((long)&(this->StripPrivateSymbols).d.ptr + 4) = (undefined1  [16])0x0;
  this->SupportUnloadOfDelayLoadedDLL = unset;
  this->SuppressStartupBanner = unset;
  this->SwapRunFromCD = unset;
  this->SwapRunFromNet = unset;
  this->TargetMachine = machineNotSet;
  this->TerminalServerAware = termSvrAwareDefault;
  this->TreatWarningsAsErrors = unset;
  this->TurnOffAssemblyGeneration = unset;
  (this->TypeLibraryFile).d.d = (Data *)0x0;
  (this->TypeLibraryFile).d.ptr = (char16_t *)0x0;
  *(undefined1 (*) [16])&(this->TypeLibraryFile).d.size = (undefined1  [16])0x0;
  (this->Version).d.d = (Data *)0x0;
  (this->Version).d.ptr = (char16_t *)0x0;
  (this->Version).d.size = 0;
  this->GenerateManifest = unset;
  (this->AdditionalManifestDependencies).d.d = (Data *)0x0;
  (this->AdditionalManifestDependencies).d.ptr = (QString *)0x0;
  *(undefined1 (*) [16])&(this->AdditionalManifestDependencies).d.size = (undefined1  [16])0x0;
  (this->ManifestFile).d.ptr = (char16_t *)0x0;
  (this->ManifestFile).d.size = 0;
  this->EnableUAC = unset;
  (this->UACExecutionLevel).d.d = (Data *)0x0;
  (this->UACExecutionLevel).d.ptr = (char16_t *)0x0;
  (this->UACExecutionLevel).d.size = 0;
  this->UACUIAccess = unset;
  this->AssemblyDebug = unset;
  *(undefined4 *)&this->SectionAlignment = 0xffffffff;
  *(undefined4 *)((long)&this->SectionAlignment + 4) = 0xffffffff;
  this->PreventDllBinding = unset;
  this->AllowIsolation = unset;
  (this->CLRThreadAttribute).d.ptr = (char16_t *)0x0;
  (this->CLRThreadAttribute).d.size = 0;
  *(undefined1 (*) [16])&(this->CLRSupportLastError).d.size = (undefined1  [16])0x0;
  (this->CLRSupportLastError).d.d = (Data *)0x0;
  (this->CLRSupportLastError).d.ptr = (char16_t *)0x0;
  (this->CLRImageType).d.ptr = (char16_t *)0x0;
  (this->CLRImageType).d.size = 0;
  *(undefined1 (*) [16])&(this->AssemblyLinkResource).d.size = (undefined1  [16])0x0;
  (this->AssemblyLinkResource).d.d = (Data *)0x0;
  (this->AssemblyLinkResource).d.ptr = (QString *)0x0;
  this->CLRUnmanagedCodeCheck = unset;
  this->DelaySign = unset;
  (this->LinkErrorReporting).d.size = 0;
  (this->LinkErrorReporting).d.d = (Data *)0x0;
  (this->LinkErrorReporting).d.ptr = (char16_t *)0x0;
  (this->KeyFile).d.ptr = (char16_t *)0x0;
  (this->KeyFile).d.size = 0;
  *(undefined1 (*) [16])&(this->KeyContainer).d.size = (undefined1  [16])0x0;
  (this->KeyContainer).d.d = (Data *)0x0;
  (this->KeyContainer).d.ptr = (char16_t *)0x0;
  this->GenerateWindowsMetadata = unset;
  (this->WindowsMetadataFile).d.size = 0;
  (this->WindowsMetadataFile).d.d = (Data *)0x0;
  (this->WindowsMetadataFile).d.ptr = (char16_t *)0x0;
  return;
}

Assistant:

VCLinkerTool::VCLinkerTool()
    :   DataExecutionPrevention(unset),
        EnableCOMDATFolding(optFoldingDefault),
        GenerateDebugInformation(unset),
        DebugInfoOption(linkerDebugOptionNone),
        GenerateMapFile(unset),
        HeapCommitSize(-1),
        HeapReserveSize(-1),
        IgnoreAllDefaultLibraries(unset),
        IgnoreEmbeddedIDL(unset),
        IgnoreImportLibrary(_True),
        ImageHasSafeExceptionHandlers(unset),
        LargeAddressAware(addrAwareDefault),
        LinkDLL(unset),
        LinkIncremental(linkIncrementalDefault),
        LinkTimeCodeGeneration(optLTCGDefault),
        MapExports(unset),
        MapLines(unset),
        OptimizeForWindows98(optWin98Default),
        OptimizeReferences(optReferencesDefault),
        RandomizedBaseAddress(unset),
        RegisterOutput(unset),
        ResourceOnlyDLL(unset),
        SetChecksum(unset),
        ShowProgress(linkProgressNotSet),
        StackCommitSize(-1),
        StackReserveSize(-1),
        SubSystem(subSystemNotSet),
        SupportUnloadOfDelayLoadedDLL(unset),
        SuppressStartupBanner(unset),
        SwapRunFromCD(unset),
        SwapRunFromNet(unset),
        TargetMachine(machineNotSet),
        TerminalServerAware(termSvrAwareDefault),
        TreatWarningsAsErrors(unset),
        TurnOffAssemblyGeneration(unset),
        TypeLibraryResourceID(0),
        GenerateManifest(unset),
        EnableUAC(unset),
        UACUIAccess(unset),
        SectionAlignment(-1),
        PreventDllBinding(unset),
        AllowIsolation(unset),
        AssemblyDebug(unset),
        CLRUnmanagedCodeCheck(unset),
        DelaySign(unset),
        GenerateWindowsMetadata(unset)
{
}